

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O2

void Msat_ClausePrint(Msat_Clause_t *pC)

{
  char *pcVar1;
  ulong uVar2;
  
  if (pC == (Msat_Clause_t *)0x0) {
    printf("NULL pointer");
  }
  else {
    if ((*(uint *)&pC->field_0x4 & 1) != 0) {
      printf("Act = %.4f  ",
             (double)*(float *)((long)&pC[1].Num + (ulong)(*(uint *)&pC->field_0x4 >> 1 & 0xfffc)));
    }
    for (uVar2 = 0; uVar2 < (*(uint *)&pC->field_0x4 >> 3 & 0x3fff); uVar2 = uVar2 + 1) {
      pcVar1 = "-";
      if (((&pC[1].Num)[uVar2] & 1U) == 0) {
        pcVar1 = "";
      }
      printf(" %s%d",pcVar1,(ulong)((&pC[1].Num)[uVar2] / 2 + 1));
    }
  }
  putchar(10);
  return;
}

Assistant:

void Msat_ClausePrint( Msat_Clause_t * pC )
{
    int i;
    if ( pC == NULL )
        printf( "NULL pointer" );
    else 
    {
        if ( pC->fLearned )
            printf( "Act = %.4f  ", Msat_ClauseReadActivity(pC) );
        for ( i = 0; i < (int)pC->nSize; i++ )
            printf( " %s%d", ((pC->pData[i]&1)? "-": ""),  pC->pData[i]/2 + 1 );
    }
    printf( "\n" );
}